

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_free(void *ptr,comex_group_t group)

{
  int in_ESI;
  long in_RDI;
  MPI_Comm comm;
  comex_igroup_t *igroup;
  comex_group_t in_stack_00000084;
  comex_group_t in_stack_ffffffffffffffdc;
  
  if (in_RDI == 0) {
    __assert_fail("NULL != ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x894,"int comex_free(void *, comex_group_t)");
  }
  if (-1 < in_ESI) {
    comex_get_igroup_from_group(in_stack_ffffffffffffffdc);
    comex_free_local((void *)0x1b8d9a);
    comex_barrier(in_stack_00000084);
    return 0;
  }
  __assert_fail("group >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x895,"int comex_free(void *, comex_group_t)");
}

Assistant:

int comex_free(void *ptr, comex_group_t group)
{
    comex_igroup_t *igroup = NULL;
    MPI_Comm comm = MPI_COMM_NULL;

    /* preconditions */
    assert(NULL != ptr);
    assert(group >= 0);

    igroup = comex_get_igroup_from_group(group);
    comm = igroup->comm;

    /* remove my ptr from reg cache and free ptr */
    comex_free_local(ptr);

    /* Synchronize: required by ARMCI semantics */
    comex_barrier(group);

    return COMEX_SUCCESS;
}